

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

attack_result *
make_ranged_throw(attack_result *__return_storage_ptr__,player *p,object *obj,loc_conflict grid)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t local_38;
  wchar_t local_34;
  wchar_t s;
  wchar_t b;
  monster *mon;
  char *hit_verb;
  object *obj_local;
  player *p_local;
  loc_conflict grid_local;
  
  hit_verb = (char *)obj;
  obj_local = (object *)p;
  p_local = (player *)grid;
  mon = (monster *)mem_alloc(0x14);
  __return_storage_ptr__->success = false;
  __return_storage_ptr__->dmg = 0;
  __return_storage_ptr__->msg_type = 0;
  __return_storage_ptr__->hit_verb = (char *)mon;
  _s = square_monster((chunk *)cave,(loc_conflict)p_local);
  local_34 = L'\0';
  local_38 = L'\0';
  my_strcpy((char *)mon,"hits",0x14);
  wVar2 = chance_of_missile_hit((player *)obj_local,(object *)hit_verb,(object *)0x0,_s);
  _Var1 = test_hit(wVar2,_s->race->ac);
  if (_Var1) {
    __return_storage_ptr__->success = true;
    improve_attack_modifier
              ((player *)obj_local,(object *)hit_verb,_s,&local_34,&local_38,
               __return_storage_ptr__->hit_verb,true);
    if ((obj_local[1].el_info[8].res_level & 1) == 0) {
      wVar2 = ranged_damage((player *)obj_local,_s,(object *)hit_verb,(object *)0x0,local_34,
                            local_38);
      __return_storage_ptr__->dmg = wVar2;
      wVar2 = critical_shot((player *)obj_local,_s,(int)*(short *)(hit_verb + 0x40),
                            (int)*(short *)(hit_verb + 0x48),__return_storage_ptr__->dmg,false,
                            &__return_storage_ptr__->msg_type);
      __return_storage_ptr__->dmg = wVar2;
    }
    else {
      wVar2 = o_ranged_damage((player *)obj_local,_s,(object *)hit_verb,(object *)0x0,local_34,
                              local_38,&__return_storage_ptr__->msg_type);
      __return_storage_ptr__->dmg = wVar2;
    }
    _Var1 = flag_has_dbg((bitflag *)(hit_verb + 0x4c),5,0x23,"obj->flags","OF_EXPLODE");
    if (_Var1) {
      __return_storage_ptr__->dmg = __return_storage_ptr__->dmg * 3;
    }
    learn_brand_slay_from_throw((player *)obj_local,(object *)hit_verb,_s);
  }
  return __return_storage_ptr__;
}

Assistant:

struct attack_result make_ranged_throw(struct player *p,
	struct object *obj, struct loc grid)
{
	char *hit_verb = mem_alloc(20 * sizeof(char));
	struct attack_result result = {false, 0, 0, hit_verb};
	struct monster *mon = square_monster(cave, grid);
	int b = 0, s = 0;

	my_strcpy(hit_verb, "hits", 20);

	/* If we missed then we're done */
	if (!test_hit(chance_of_missile_hit(p, obj, NULL, mon), mon->race->ac))
		return result;

	result.success = true;

	improve_attack_modifier(p, obj, mon, &b, &s, result.hit_verb, true);

	if (!OPT(p, birth_percent_damage)) {
		result.dmg = ranged_damage(p, mon, obj, NULL, b, s);
		result.dmg = critical_shot(p, mon, obj->weight, obj->to_h,
			result.dmg, false, &result.msg_type);
	} else {
		result.dmg = o_ranged_damage(p, mon, obj, NULL, b, s, &result.msg_type);
	}

	/* Direct adjustment for exploding things (flasks of oil) */
	if (of_has(obj->flags, OF_EXPLODE))
		result.dmg *= 3;

	learn_brand_slay_from_throw(p, obj, mon);

	return result;
}